

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void zisofs_detect_magic(archive_write *a,void *buff,size_t s)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int64_t iVar7;
  ulong in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t l;
  int64_t entry_size;
  int magic_max;
  uint32_t bed;
  uint32_t bst;
  size_t doff;
  size_t _ceil;
  uchar log2_bs;
  uchar header_size;
  uint32_t uncompressed_size;
  uchar *magic_buff;
  uchar *endp;
  uchar *p;
  isofile *file;
  iso9660_conflict *iso9660;
  size_t local_78;
  int local_64;
  ulong local_58;
  long local_50;
  long *local_40;
  long *local_30;
  
  lVar2 = *(long *)(in_RDI + 0xd0);
  lVar3 = *(long *)(lVar2 + 0x10);
  iVar7 = archive_entry_size(*(archive_entry **)(lVar3 + 0x20));
  if (iVar7 < 0x40) {
    local_64 = (int)iVar7;
  }
  else {
    local_64 = 0x40;
  }
  if ((*(int *)(lVar2 + 0x21c) != 0) || (local_40 = in_RSI, in_RDX < (ulong)(long)local_64)) {
    if (*(int *)(lVar2 + 0x21c) < local_64) {
      local_78 = 0x40 - (long)*(int *)(lVar2 + 0x21c);
      if (in_RDX < local_78) {
        local_78 = in_RDX;
      }
      memcpy((void *)(lVar2 + 0x1d9 + (long)*(int *)(lVar2 + 0x21c)),in_RSI,local_78);
      *(int *)(lVar2 + 0x21c) = (int)local_78 + *(int *)(lVar2 + 0x21c);
      if (*(int *)(lVar2 + 0x21c) < local_64) {
        return;
      }
    }
    local_40 = (long *)(lVar2 + 0x1d9);
  }
  *(byte *)(lVar2 + 0x1d8) = *(byte *)(lVar2 + 0x1d8) & 0xfe;
  if (*local_40 == 0x7d6dbc99653e437) {
    uVar4 = archive_le32dec(local_40 + 1);
    bVar1 = *(byte *)((long)local_40 + 0xd);
    if ((((0x17 < uVar4) && (*(char *)((long)local_40 + 0xc) == '\x04')) && (bVar1 < 0x1f)) &&
       (6 < bVar1)) {
      local_50 = (long)((ulong)uVar4 + (1L << (bVar1 & 0x3f)) + -1) >> (bVar1 & 0x3f);
      local_58 = (local_50 + 1) * 4 + 0x10;
      if ((long)local_58 <= iVar7) {
        local_30 = local_40 + 2;
        for (; local_50 != 0 && local_30 + 1 <= (long *)((long)local_40 + (long)local_64);
            local_50 = local_50 + -1) {
          uVar5 = archive_le32dec(local_30);
          if (uVar5 != local_58) {
            return;
          }
          local_30 = (long *)((long)local_30 + 4);
          uVar6 = archive_le32dec(local_30);
          if (uVar6 < uVar5) {
            return;
          }
          if (iVar7 < (long)(ulong)uVar6) {
            return;
          }
          local_58 = (uVar6 - uVar5) + local_58;
        }
        *(uint32_t *)(lVar3 + 0xc4) = uVar4;
        *(undefined1 *)(lVar3 + 0xc0) = 4;
        *(byte *)(lVar3 + 0xc1) = bVar1;
        *(byte *)(lVar2 + 0x1d8) = *(byte *)(lVar2 + 0x1d8) & 0xfd;
      }
    }
  }
  return;
}

Assistant:

static void
zisofs_detect_magic(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *p, *endp;
	const unsigned char *magic_buff;
	uint32_t uncompressed_size;
	unsigned char header_size;
	unsigned char log2_bs;
	size_t _ceil, doff;
	uint32_t bst, bed;
	int magic_max;
	int64_t entry_size;

	entry_size = archive_entry_size(file->entry);
	if ((int64_t)sizeof(iso9660->zisofs.magic_buffer) > entry_size)
		magic_max = (int)entry_size;
	else
		magic_max = sizeof(iso9660->zisofs.magic_buffer);

	if (iso9660->zisofs.magic_cnt == 0 && s >= (size_t)magic_max)
		/* It's unnecessary we copy buffer. */
		magic_buff = buff;
	else {
		if (iso9660->zisofs.magic_cnt < magic_max) {
			size_t l;

			l = sizeof(iso9660->zisofs.magic_buffer)
			    - iso9660->zisofs.magic_cnt;
			if (l > s)
				l = s;
			memcpy(iso9660->zisofs.magic_buffer
			    + iso9660->zisofs.magic_cnt, buff, l);
			iso9660->zisofs.magic_cnt += (int)l;
			if (iso9660->zisofs.magic_cnt < magic_max)
				return;
		}
		magic_buff = iso9660->zisofs.magic_buffer;
	}
	iso9660->zisofs.detect_magic = 0;
	p = magic_buff;

	/* Check the magic code of zisofs. */
	if (memcmp(p, zisofs_magic, sizeof(zisofs_magic)) != 0)
		/* This is not zisofs file which made by mkzftree. */
		return;
	p += sizeof(zisofs_magic);

	/* Read a zisofs header. */
	uncompressed_size = archive_le32dec(p);
	header_size = p[4];
	log2_bs = p[5];
	if (uncompressed_size < 24 || header_size != 4 ||
	    log2_bs > 30 || log2_bs < 7)
		return;/* Invalid or not supported header. */

	/* Calculate a size of Block Pointers of zisofs. */
	_ceil = (uncompressed_size +
	        (ARCHIVE_LITERAL_LL(1) << log2_bs) -1) >> log2_bs;
	doff = (_ceil + 1) * 4 + 16;
	if (entry_size < (int64_t)doff)
		return;/* Invalid data. */

	/* Check every Block Pointer has valid value. */
	p = magic_buff + 16;
	endp = magic_buff + magic_max;
	while (_ceil && p + 8 <= endp) {
		bst = archive_le32dec(p);
		if (bst != doff)
			return;/* Invalid data. */
		p += 4;
		bed = archive_le32dec(p);
		if (bed < bst || bed > entry_size)
			return;/* Invalid data. */
		doff += bed - bst;
		_ceil--;
	}

	file->zisofs.uncompressed_size = uncompressed_size;
	file->zisofs.header_size = header_size;
	file->zisofs.log2_bs = log2_bs;

	/* Disable making a zisofs image. */
	iso9660->zisofs.making = 0;
}